

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::DBImpl(DBImpl *this,Options *raw_options,string *dbname)

{
  Options *__return_storage_ptr__;
  string *dbname_00;
  _Rb_tree_header *p_Var1;
  long lVar2;
  Comparator *pCVar3;
  FilterPolicy *pFVar4;
  Cache *pCVar5;
  TableCache *this_00;
  WriteBatch *this_01;
  VersionSet *this_02;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DB)._vptr_DB = (_func_int **)&PTR__DBImpl_01156340;
  this->env_ = raw_options->env;
  pCVar3 = raw_options->comparator;
  (this->internal_comparator_).super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_01156570;
  (this->internal_comparator_).user_comparator_ = pCVar3;
  pFVar4 = raw_options->filter_policy;
  (this->internal_filter_policy_).super_FilterPolicy._vptr_FilterPolicy =
       (_func_int **)&PTR__FilterPolicy_011565c8;
  (this->internal_filter_policy_).user_policy_ = pFVar4;
  __return_storage_ptr__ = &this->options_;
  SanitizeOptions(__return_storage_ptr__,dbname,&this->internal_comparator_,
                  &this->internal_filter_policy_,raw_options);
  pCVar5 = (this->options_).block_cache;
  this->owns_info_log_ = (this->options_).info_log != raw_options->info_log;
  this->owns_cache_ = pCVar5 != raw_options->block_cache;
  dbname_00 = &this->dbname_;
  std::__cxx11::string::string((string *)dbname_00,dbname);
  this_00 = (TableCache *)operator_new(0x38);
  TableCache::TableCache
            (this_00,dbname_00,__return_storage_ptr__,(this->options_).max_open_files + -10);
  this->table_cache_ = this_00;
  this->db_lock_ = (FileLock *)0x0;
  (this->mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).mu_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).mu_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutex_).mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->shutting_down_)._M_base._M_i = false;
  std::condition_variable::condition_variable(&(this->background_work_finished_signal_).cv_);
  (this->background_work_finished_signal_).mu_ = &this->mutex_;
  this->mem_ = (MemTable *)0x0;
  this->imm_ = (MemTable *)0x0;
  (this->has_imm_)._M_base._M_i = false;
  this->logfile_ = (WritableFile *)0x0;
  this->logfile_number_ = 0;
  *(undefined8 *)((long)&this->logfile_number_ + 4) = 0;
  *(undefined8 *)((long)&this->log_ + 4) = 0;
  std::_Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
  _Deque_base(&(this->writers_).
               super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
             );
  this_01 = (WriteBatch *)operator_new(0x20);
  WriteBatch::WriteBatch(this_01);
  this->tmp_batch_ = this_01;
  (this->snapshots_).head_.super_Snapshot._vptr_Snapshot = (_func_int **)&PTR__Snapshot_011564b8;
  (this->snapshots_).head_.sequence_number_ = 0;
  (this->snapshots_).head_.list_ = (SnapshotList *)0x0;
  (this->snapshots_).head_.prev_ = &(this->snapshots_).head_;
  (this->snapshots_).head_.next_ = &(this->snapshots_).head_;
  p_Var1 = &(this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header;
  (this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->background_compaction_scheduled_ = false;
  this->manual_compaction_ = (ManualCompaction *)0x0;
  this_02 = (VersionSet *)operator_new(0x250);
  VersionSet::VersionSet
            (this_02,dbname_00,__return_storage_ptr__,this->table_cache_,&this->internal_comparator_
            );
  this->versions_ = this_02;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    memset(&this->bg_error_,0,0xb0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

DBImpl::DBImpl(const Options& raw_options, const std::string& dbname)
    : env_(raw_options.env),
      internal_comparator_(raw_options.comparator),
      internal_filter_policy_(raw_options.filter_policy),
      options_(SanitizeOptions(dbname, &internal_comparator_,
                               &internal_filter_policy_, raw_options)),
      owns_info_log_(options_.info_log != raw_options.info_log),
      owns_cache_(options_.block_cache != raw_options.block_cache),
      dbname_(dbname),
      table_cache_(new TableCache(dbname_, options_, TableCacheSize(options_))),
      db_lock_(nullptr),
      shutting_down_(false),
      background_work_finished_signal_(&mutex_),
      mem_(nullptr),
      imm_(nullptr),
      has_imm_(false),
      logfile_(nullptr),
      logfile_number_(0),
      log_(nullptr),
      seed_(0),
      tmp_batch_(new WriteBatch),
      background_compaction_scheduled_(false),
      manual_compaction_(nullptr),
      versions_(new VersionSet(dbname_, &options_, table_cache_,
                               &internal_comparator_)) {}